

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::NewKey
          (TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_> *this,
          short key)

{
  Node *pNVar1;
  IPair IVar2;
  undefined2 uVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  undefined2 in_register_00000032;
  
  while (uVar5 = this->Size - 1 & CONCAT22(in_register_00000032,key), pNVar1 = this->Nodes + uVar5,
        this->Nodes[uVar5].Next != (Node *)0x1) {
    pNVar4 = GetFreePos(this);
    if (pNVar4 != (Node *)0x0) {
      pNVar7 = this->Nodes + (this->Size - 1 & (int)(pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (int)(pNVar1->Pair).Key) != pNVar1) goto LAB_0054474e;
      pNVar4->Next = pNVar1->Next;
      pNVar7 = pNVar4;
      goto LAB_00544768;
    }
    Rehash(this);
  }
LAB_00544763:
  pNVar4 = (Node *)0x0;
  pNVar7 = pNVar1;
LAB_00544768:
  pNVar1->Next = pNVar4;
  this->NumUsed = this->NumUsed + 1;
  (pNVar7->Pair).Key = key;
  return pNVar7;
LAB_0054474e:
  do {
    pNVar6 = pNVar7;
    pNVar7 = pNVar6->Next;
  } while (pNVar7 != pNVar1);
  pNVar6->Next = pNVar4;
  IVar2 = pNVar1->Pair;
  uVar3 = *(undefined2 *)&pNVar1->field_0xe;
  pNVar4->Next = pNVar1->Next;
  pNVar4->Pair = IVar2;
  *(undefined2 *)&pNVar4->field_0xe = uVar3;
  goto LAB_00544763;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}